

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workWithFilesAndCiphertext.h
# Opt level: O2

string * getBits_abi_cxx11_(string *__return_storage_ptr__,
                           vector<unsigned_int,_std::allocator<unsigned_int>_> *arr)

{
  uint *puVar1;
  uint *puVar2;
  bitset<32UL> bits;
  ulong local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  puVar1 = (arr->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar2 = (arr->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    local_50 = (ulong)*puVar2;
    std::bitset<32ul>::to_string<char,std::char_traits<char>,std::allocator<char>>
              (&local_48,(bitset<32ul> *)&local_50);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getBits(const std::vector<unsigned> &arr) {
    std::string arrBits;
    for (const auto dword : arr) {
        std::bitset<32> bits(dword);
        arrBits += bits.to_string();
    }

    return arrBits;
}